

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O1

void duckdb::FindMatchingPrimaryKeyColumns
               (ColumnList *columns,
               vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
               *constraints,ForeignKeyConstraint *fk)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  pointer pCVar6;
  UniqueConstraint *this;
  LogicalIndex logical;
  ColumnDefinition *this_00;
  string *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x_00;
  reference l1;
  reference l2;
  BinderException *pBVar7;
  char *pcVar8;
  size_type __n;
  char *pcVar9;
  pointer this_01;
  pointer name;
  bool bVar10;
  bool bVar11;
  string fk_name_str;
  string fk_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  pk_names;
  string local_1d8;
  string local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  pointer local_178;
  pointer local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_168;
  ColumnList *local_160;
  pointer local_158;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_168 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&fk->pk_columns;
  local_170 = (fk->pk_columns).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_178 = (fk->pk_columns).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = (constraints->
            super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_158 = (constraints->
              super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  bVar10 = this_01 == local_158;
  local_160 = columns;
  if (bVar10) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    do {
      pCVar6 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->(this_01);
      bVar11 = true;
      if (pCVar6->type == UNIQUE) {
        pCVar6 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->(this_01);
        this = Constraint::Cast<duckdb::UniqueConstraint>(pCVar6);
        if ((local_170 != local_178) || (bVar4 = UniqueConstraint::IsPrimaryKey(this), bVar4)) {
          local_198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar5 = UniqueConstraint::HasIndex(this);
          if (bVar5) {
            logical = UniqueConstraint::GetIndex(this);
            this_00 = ColumnList::GetColumn(local_160,logical);
            __x = ColumnDefinition::Name_abi_cxx11_(this_00);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_198,__x);
          }
          else {
            __x_00 = &UniqueConstraint::GetColumnNames_abi_cxx11_(this)->
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ;
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_198,__x_00);
          }
          if (local_170 == local_178) {
            if ((long)local_198.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_198.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                (long)(fk->fk_columns).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(fk->fk_columns).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,",","");
              StringUtil::Join(&local_1b8,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)&local_198,&local_1d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p);
              }
              paVar1 = &local_150.field_2;
              local_150._M_dataplus._M_p = (pointer)paVar1;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,",","");
              StringUtil::Join(&local_1d8,&fk->fk_columns,&local_150);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != paVar1) {
                operator_delete(local_150._M_dataplus._M_p);
              }
              pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
              local_150._M_dataplus._M_p = (pointer)paVar1;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_150,
                         "Failed to create foreign key: number of referencing (%s) and referenced columns (%s) differ"
                         ,"");
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,local_1d8._M_dataplus._M_p,
                         local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,local_1b8._M_dataplus._M_p,
                         local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
              BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                        (pBVar7,&local_150,&local_50,&local_f0);
              __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(local_168,&local_198);
            bVar11 = false;
          }
          else if ((long)local_198.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_198.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                   (long)(fk->fk_columns).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(fk->fk_columns).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) {
            bVar11 = (fk->pk_columns).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish !=
                     (fk->pk_columns).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (bVar11) {
              __n = 0;
              do {
                l1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                   *)local_168,__n);
                l2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                   *)&local_198,__n);
                bVar5 = StringUtil::CIEquals(l1,l2);
                if (!bVar5) goto LAB_011ef75b;
                __n = __n + 1;
                bVar11 = __n < (ulong)((long)(fk->pk_columns).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(fk->pk_columns).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5);
              } while (bVar11);
            }
          }
          else {
LAB_011ef75b:
            bVar11 = true;
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_198);
          bVar5 = true;
        }
      }
      if (!bVar11) break;
      this_01 = this_01 + 1;
      bVar10 = this_01 == local_158;
    } while (!bVar10);
  }
  if (!bVar10) {
    return;
  }
  if (!bVar5) {
    pcVar9 = "primary key or unique constraint";
    if (local_170 == local_178) {
      pcVar9 = "primary key";
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    pcVar8 = pcVar9 + 0x20;
    if (local_170 == local_178) {
      pcVar8 = pcVar9 + 0xb;
    }
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,pcVar9,pcVar8);
    pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d8,
               "Failed to create foreign key: there is no %s for referenced table \"%s\"","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_1b8._M_dataplus._M_p,
               local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    pcVar3 = (fk->info).table._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar3,pcVar3 + (fk->info).table._M_string_length);
    BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
              (pBVar7,&local_1d8,&local_70,&local_110);
    __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  name = (fk->pk_columns).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (fk->pk_columns).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (name == pbVar2) {
      paVar1 = &local_1d8.field_2;
      local_1d8._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,",","");
      StringUtil::Join(&local_1b8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)local_168,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
      local_1d8._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,
                 "Failed to create foreign key: referenced table \"%s\" does not have a primary key or unique constraint on the columns %s"
                 ,"");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar3 = (fk->info).table._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar3,pcVar3 + (fk->info).table._M_string_length);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_1b8._M_dataplus._M_p,
                 local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
      BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                (pBVar7,&local_1d8,&local_b0,&local_d0);
      __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar10 = ColumnList::ColumnExists(local_160,name);
    if (!bVar10) break;
    name = name + 1;
  }
  pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,
             "Failed to create foreign key: referenced table \"%s\" does not have a column named \"%s\""
             ,"");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar3 = (fk->info).table._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + (fk->info).table._M_string_length);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  pcVar3 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar3,pcVar3 + name->_M_string_length);
  BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
            (pBVar7,&local_1b8,&local_90,&local_130);
  __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void FindMatchingPrimaryKeyColumns(const ColumnList &columns, const vector<unique_ptr<Constraint>> &constraints,
                                          ForeignKeyConstraint &fk) {
	// find the matching primary key constraint
	bool found_constraint = false;
	// if no columns are defined, we will automatically try to bind to the primary key
	bool find_primary_key = fk.pk_columns.empty();
	for (auto &constr : constraints) {
		if (constr->type != ConstraintType::UNIQUE) {
			continue;
		}
		auto &unique = constr->Cast<UniqueConstraint>();
		if (find_primary_key && !unique.IsPrimaryKey()) {
			continue;
		}
		found_constraint = true;

		vector<string> pk_names;
		if (unique.HasIndex()) {
			pk_names.push_back(columns.GetColumn(LogicalIndex(unique.GetIndex())).Name());
		} else {
			pk_names = unique.GetColumnNames();
		}
		if (find_primary_key) {
			// found matching primary key
			if (pk_names.size() != fk.fk_columns.size()) {
				auto pk_name_str = StringUtil::Join(pk_names, ",");
				auto fk_name_str = StringUtil::Join(fk.fk_columns, ",");
				throw BinderException(
				    "Failed to create foreign key: number of referencing (%s) and referenced columns (%s) differ",
				    fk_name_str, pk_name_str);
			}
			fk.pk_columns = pk_names;
			return;
		}
		if (pk_names.size() != fk.fk_columns.size()) {
			// the number of referencing and referenced columns for foreign keys must be the same
			continue;
		}
		bool equals = true;
		for (idx_t i = 0; i < fk.pk_columns.size(); i++) {
			if (!StringUtil::CIEquals(fk.pk_columns[i], pk_names[i])) {
				equals = false;
				break;
			}
		}
		if (!equals) {
			continue;
		}
		// found match
		return;
	}
	// no match found! examine why
	if (!found_constraint) {
		// no unique constraint or primary key
		string search_term = find_primary_key ? "primary key" : "primary key or unique constraint";
		throw BinderException("Failed to create foreign key: there is no %s for referenced table \"%s\"", search_term,
		                      fk.info.table);
	}
	// check if all the columns exist
	for (auto &name : fk.pk_columns) {
		bool found = columns.ColumnExists(name);
		if (!found) {
			throw BinderException(
			    "Failed to create foreign key: referenced table \"%s\" does not have a column named \"%s\"",
			    fk.info.table, name);
		}
	}
	auto fk_names = StringUtil::Join(fk.pk_columns, ",");
	throw BinderException("Failed to create foreign key: referenced table \"%s\" does not have a primary key or unique "
	                      "constraint on the columns %s",
	                      fk.info.table, fk_names);
}